

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_RepeatedMapFieldTest_RepeatedKey_Test::TestBody
          (ComparisonTest_RepeatedMapFieldTest_RepeatedKey_Test *this)

{
  void *pvVar1;
  Arena *pAVar2;
  char *message;
  string_view value;
  string_view value_00;
  string_view value_01;
  AssertionResult gtest_ar;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  AssertHelper local_1c0;
  internal local_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  string local_1a8;
  undefined1 local_188 [16];
  undefined1 local_178 [168];
  undefined1 local_d0 [16];
  undefined1 local_c0 [168];
  
  (this->super_ComparisonTest).repeated_field_as_set_ = true;
  local_d0._0_8_ = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"item","");
  local_188._0_8_ = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"rb","");
  std::__cxx11::string::_M_assign((string *)&(this->super_ComparisonTest).map_field_);
  std::__cxx11::string::_M_assign((string *)&(this->super_ComparisonTest).map_key_);
  if ((undefined1 *)local_188._0_8_ != local_178) {
    operator_delete((void *)local_188._0_8_,
                    (ulong)((long)&((ThreadSafeArena *)local_178._0_8_)->tag_and_id_ + 1));
  }
  if ((undefined1 *)local_d0._0_8_ != local_c0) {
    operator_delete((void *)local_d0._0_8_,
                    (ulong)((long)&((ThreadSafeArena *)local_c0._0_8_)->tag_and_id_ + 1));
  }
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_d0,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_188,(Arena *)0x0);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_c0 + 0x20),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[2]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)pvVar1 + 0x28),(char (*) [2])0x12820b7);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[2]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)pvVar1 + 0x28),(char (*) [2])0x128240e);
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  value._M_str = "first";
  value._M_len = 5;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar1 + 0x88),value,pAVar2);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_178 + 0x20),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[2]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)pvVar1 + 0x28),(char (*) [2])0x121fc8d);
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  value_00._M_str = "second";
  value_00._M_len = 6;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar1 + 0x88),value_00,pAVar2);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_178 + 0x20),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[2]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)pvVar1 + 0x28),(char (*) [2])0x128240e);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[2]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)pvVar1 + 0x28),(char (*) [2])0x12820b7);
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  value_01._M_str = "fist";
  value_01._M_len = 4;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar1 + 0x88),value_01,pAVar2);
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_1a8,this,(Message *)local_d0,(Message *)local_188);
  testing::internal::CmpHelperEQ<char[181],std::__cxx11::string>
            (local_1b8,
             "\"modified: item[0].b -> item[1].b: \\\"first\\\" -> \\\"fist\\\"\\n\" \"moved: item[0].rb[0] -> item[1].rb[1] : \\\"a\\\"\\n\" \"moved: item[0].rb[1] -> item[1].rb[0] : \\\"b\\\"\\n\" \"added: item[0]: { b: \\\"second\\\" rb: \\\"c\\\" }\\n\""
             ,"Run(msg1, msg2)",
             (char (*) [181])
             "modified: item[0].b -> item[1].b: \"first\" -> \"fist\"\nmoved: item[0].rb[0] -> item[1].rb[1] : \"a\"\nmoved: item[0].rb[1] -> item[1].rb[0] : \"b\"\nadded: item[0]: { b: \"second\" rb: \"c\" }\n"
             ,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xcec,message);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1a8._M_dataplus._M_p + 8))();
    }
  }
  if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b0,local_1b0);
  }
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_188);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_d0);
  return;
}

Assistant:

TEST_F(ComparisonTest, RepeatedMapFieldTest_RepeatedKey) {
  // used rb as a key, but b is the value.
  repeated_field_as_set();
  field_as_map("item", "rb");

  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->add_rb("a");
  item->add_rb("b");
  item->set_b("first");

  item = msg2.add_item();
  item->add_rb("c");
  item->set_b("second");

  item = msg2.add_item();
  item->add_rb("b");
  item->add_rb("a");
  item->set_b("fist");

  EXPECT_EQ(
      "modified: item[0].b -> item[1].b: \"first\" -> \"fist\"\n"
      "moved: item[0].rb[0] -> item[1].rb[1] : \"a\"\n"
      "moved: item[0].rb[1] -> item[1].rb[0] : \"b\"\n"
      "added: item[0]: { b: \"second\" rb: \"c\" }\n",
      Run(msg1, msg2));
}